

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O2

void ModuleEntry(Environment *env)

{
  undefined4 uVar1;
  ostream *poVar2;
  _func_void_Environment_ptr *extraout_RDX;
  Word WVar3;
  allocator<char> local_39;
  string local_38 [32];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Std library loaded");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"hello",&local_39);
  uVar1 = huelang::DefinitionTable::TokToWord(env,local_38);
  std::__cxx11::string::~string(local_38);
  WVar3.minor._0_4_ = uVar1;
  WVar3._0_8_ = env;
  WVar3.minor._4_4_ = 0;
  huelang::Environment::AddPrimaryDefinition(WVar3,extraout_RDX);
  return;
}

Assistant:

void ModuleEntry(Environment *env) {
    cout << "Std library loaded" << endl;
    Word helloword = env->definitionTable.TokToWord("hello");
    env->AddPrimaryDefinition(helloword, &__hello);
}